

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_2> *
tcu::operator*(Matrix<float,_4,_2> *__return_storage_ptr__,Matrix<float,_4,_3> *a,
              Matrix<float,_3,_2> *b)

{
  Vector<float,_4> *pVVar1;
  bool bVar2;
  int row;
  long lVar3;
  Matrix<float,_4,_2> *res;
  bool bVar4;
  long lVar5;
  long lVar6;
  float v;
  float fVar7;
  
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 1.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 1.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)a + lVar6 * 4) *
                        *(float *)((long)(b->m_data).m_data[lVar5].m_data + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar3] = fVar7;
      lVar5 = 1;
      bVar2 = false;
    } while (bVar4);
    lVar3 = lVar3 + 1;
    a = (Matrix<float,_4,_3> *)((long)a + 4);
  } while (lVar3 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}